

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5MultiIterFree(Fts5Iter *pIter)

{
  Fts5Buffer *pFVar1;
  long lVar2;
  
  if (pIter != (Fts5Iter *)0x0) {
    if (0 < pIter->nSeg) {
      pFVar1 = &pIter->aSeg[0].term;
      lVar2 = 0;
      do {
        sqlite3_free(pFVar1->p);
        pFVar1->p = (u8 *)0x0;
        pFVar1->n = 0;
        pFVar1->nSpace = 0;
        sqlite3_free(*(Fts5Data **)((long)(pFVar1 + -5) + 8));
        sqlite3_free(*(Fts5Data **)(pFVar1 + -4));
        fts5DlidxIterFree(*(Fts5DlidxIter **)((long)(pFVar1 + -1) + 8));
        sqlite3_free(*(int **)(pFVar1 + -1));
        pFVar1->n = 0;
        pFVar1->nSpace = 0;
        *(i64 *)(pFVar1 + 1) = 0;
        *(Fts5DlidxIter **)((long)(pFVar1 + -1) + 8) = (Fts5DlidxIter *)0x0;
        pFVar1->p = (u8 *)0x0;
        *(undefined8 *)((long)(pFVar1 + -2) + 8) = 0;
        *(int **)(pFVar1 + -1) = (int *)0x0;
        *(undefined8 *)((long)(pFVar1 + -3) + 8) = 0;
        pFVar1[-2].p = 0;
        *(undefined8 *)((long)(pFVar1 + -4) + 8) = 0;
        *(_func_void_Fts5Index_ptr_Fts5SegIter_ptr_int_ptr **)(pFVar1 + -3) =
             (_func_void_Fts5Index_ptr_Fts5SegIter_ptr_int_ptr *)0x0;
        *(Fts5Data **)((long)(pFVar1 + -5) + 8) = (Fts5Data *)0x0;
        *(Fts5Data **)(pFVar1 + -4) = (Fts5Data *)0x0;
        *(undefined8 *)((long)(pFVar1 + -6) + 8) = 0;
        pFVar1[-5].p = 0;
        *(undefined8 *)((long)(pFVar1 + 1) + 8) = 0;
        lVar2 = lVar2 + 1;
        pFVar1 = (Fts5Buffer *)((long)(pFVar1 + 7) + 8);
      } while (lVar2 < pIter->nSeg);
    }
    sqlite3_free((pIter->poslist).p);
    (pIter->poslist).p = (u8 *)0x0;
    (pIter->poslist).n = 0;
    (pIter->poslist).nSpace = 0;
    sqlite3_free(pIter);
    return;
  }
  return;
}

Assistant:

static void fts5MultiIterFree(Fts5Iter *pIter){
  if( pIter ){
    int i;
    for(i=0; i<pIter->nSeg; i++){
      fts5SegIterClear(&pIter->aSeg[i]);
    }
    fts5BufferFree(&pIter->poslist);
    sqlite3_free(pIter);
  }
}